

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvlat1.cpp
# Opt level: O2

void ucnv_Latin1FromUTF8(UConverterFromUnicodeArgs *pFromUArgs,UConverterToUnicodeArgs *pToUArgs,
                        UErrorCode *pErrorCode)

{
  byte bVar1;
  uint uVar2;
  UConverter *pUVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  int32_t iVar7;
  byte *pbVar8;
  int iVar9;
  byte bVar10;
  
  pUVar3 = pToUArgs->converter;
  pbVar5 = (byte *)pToUArgs->source;
  pbVar8 = (byte *)pToUArgs->sourceLimit;
  pbVar4 = (byte *)pFromUArgs->target;
  iVar9 = *(int *)&pFromUArgs->targetLimit - (int)pbVar4;
  if (('\0' < pUVar3->toULength) && (uVar2 = pUVar3->toUnicodeStatus, pbVar5 < pbVar8 && uVar2 != 0)
     ) {
    if (iVar9 == 0) {
      *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
      return;
    }
    if (((uVar2 & 0xfffffffe) != 0xc2) || (bVar10 = *pbVar5, -0x41 < (char)bVar10)) {
LAB_002b1a80:
      *pErrorCode = U_USING_DEFAULT_WARNING;
      return;
    }
    pbVar5 = pbVar5 + 1;
    *pbVar4 = bVar10 | (char)uVar2 << 6;
    pbVar4 = pbVar4 + 1;
    iVar9 = iVar9 + -1;
    pUVar3->toUnicodeStatus = 0;
    pUVar3->toULength = '\0';
  }
  if ((pbVar5 < pbVar8) && ((byte)(pbVar8[-1] + 0x3e) < 0x33)) {
    pbVar8 = pbVar8 + -1;
  }
  do {
    if (pbVar8 <= pbVar5) {
      if ((*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) && (pbVar5 < pToUArgs->sourceLimit)) {
        bVar10 = *pbVar5;
        pUVar3->toUBytes[0] = bVar10;
        pUVar3->toUnicodeStatus = (uint)bVar10;
        pUVar3->toULength = '\x01';
        if ((char)bVar10 < '\0') {
          iVar7 = 0;
          if ((byte)(bVar10 + 0x3e) < 0x33) {
            iVar7 = ((uint)(0xdf < bVar10) - (uint)(bVar10 < 0xf0)) + 3;
          }
        }
        else {
          iVar7 = 1;
        }
        pbVar5 = pbVar5 + 1;
        pUVar3->mode = iVar7;
      }
LAB_002b1a6e:
      pToUArgs->source = (char *)pbVar5;
      pFromUArgs->target = (char *)pbVar4;
      return;
    }
    if (iVar9 < 1) {
      *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_002b1a6e;
    }
    pbVar6 = pbVar5 + 1;
    bVar10 = *pbVar5;
    if ((char)bVar10 < '\0') {
      if (((bVar10 & 0xfe) != 0xc2) || (bVar1 = *pbVar6, -0x41 < (char)bVar1)) {
        pToUArgs->source = (char *)pbVar5;
        pFromUArgs->target = (char *)pbVar4;
        goto LAB_002b1a80;
      }
      pbVar6 = pbVar5 + 2;
      bVar10 = bVar10 << 6 | bVar1;
    }
    *pbVar4 = bVar10;
    iVar9 = iVar9 + -1;
    pbVar4 = pbVar4 + 1;
    pbVar5 = pbVar6;
  } while( true );
}

Assistant:

static void U_CALLCONV
ucnv_Latin1FromUTF8(UConverterFromUnicodeArgs *pFromUArgs,
                    UConverterToUnicodeArgs *pToUArgs,
                    UErrorCode *pErrorCode) {
    UConverter *utf8;
    const uint8_t *source, *sourceLimit;
    uint8_t *target;
    int32_t targetCapacity;

    UChar32 c;
    uint8_t b, t1;

    /* set up the local pointers */
    utf8=pToUArgs->converter;
    source=(uint8_t *)pToUArgs->source;
    sourceLimit=(uint8_t *)pToUArgs->sourceLimit;
    target=(uint8_t *)pFromUArgs->target;
    targetCapacity=(int32_t)(pFromUArgs->targetLimit-pFromUArgs->target);

    /* get the converter state from the UTF-8 UConverter */
    if (utf8->toULength > 0) {
        c=(UChar32)utf8->toUnicodeStatus;
    } else {
        c = 0;
    }
    if(c!=0 && source<sourceLimit) {
        if(targetCapacity==0) {
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
            return;
        } else if(c>=0xc2 && c<=0xc3 && (t1=(uint8_t)(*source-0x80)) <= 0x3f) {
            ++source;
            *target++=(uint8_t)(((c&3)<<6)|t1);
            --targetCapacity;

            utf8->toUnicodeStatus=0;
            utf8->toULength=0;
        } else {
            /* complicated, illegal or unmappable input: fall back to the pivoting implementation */
            *pErrorCode=U_USING_DEFAULT_WARNING;
            return;
        }
    }

    /*
     * Make sure that the last byte sequence before sourceLimit is complete
     * or runs into a lead byte.
     * In the conversion loop compare source with sourceLimit only once
     * per multi-byte character.
     * For Latin-1, adjust sourceLimit only for 1 trail byte because
     * the conversion loop handles at most 2-byte sequences.
     */
    if(source<sourceLimit && U8_IS_LEAD(*(sourceLimit-1))) {
        --sourceLimit;
    }

    /* conversion loop */
    while(source<sourceLimit) {
        if(targetCapacity>0) {
            b=*source++;
            if(U8_IS_SINGLE(b)) {
                /* convert ASCII */
                *target++=(uint8_t)b;
                --targetCapacity;
            } else if( /* handle U+0080..U+00FF inline */
                       b>=0xc2 && b<=0xc3 &&
                       (t1=(uint8_t)(*source-0x80)) <= 0x3f
            ) {
                ++source;
                *target++=(uint8_t)(((b&3)<<6)|t1);
                --targetCapacity;
            } else {
                /* complicated, illegal or unmappable input: fall back to the pivoting implementation */
                pToUArgs->source=(char *)(source-1);
                pFromUArgs->target=(char *)target;
                *pErrorCode=U_USING_DEFAULT_WARNING;
                return;
            }
        } else {
            /* target is full */
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    /*
     * The sourceLimit may have been adjusted before the conversion loop
     * to stop before a truncated sequence.
     * If so, then collect the truncated sequence now.
     * For Latin-1, there is at most exactly one lead byte because of the
     * smaller sourceLimit adjustment logic.
     */
    if(U_SUCCESS(*pErrorCode) && source<(sourceLimit=(uint8_t *)pToUArgs->sourceLimit)) {
        utf8->toUnicodeStatus=utf8->toUBytes[0]=b=*source++;
        utf8->toULength=1;
        utf8->mode=U8_COUNT_BYTES(b);
    }

    /* write back the updated pointers */
    pToUArgs->source=(char *)source;
    pFromUArgs->target=(char *)target;
}